

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void cmLocalUnixMakefileGenerator3::WriteCMakeArgument(ostream *os,char *s)

{
  char cVar1;
  char *pcVar2;
  char *c;
  
  std::operator<<(os,"\"");
  do {
    cVar1 = *s;
    if (cVar1 == '\"') {
      pcVar2 = "\\\"";
LAB_0026d3fb:
      std::operator<<(os,pcVar2);
    }
    else {
      if (cVar1 == '\\') {
        pcVar2 = "\\\\";
        goto LAB_0026d3fb;
      }
      if (cVar1 == '\0') {
        std::operator<<(os,"\"");
        return;
      }
      std::operator<<(os,cVar1);
    }
    s = s + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteCMakeArgument(std::ostream& os,
                                                       const char* s)
{
  // Write the given string to the stream with escaping to get it back
  // into CMake through the lexical scanner.
  os << "\"";
  for (const char* c = s; *c; ++c) {
    if (*c == '\\') {
      os << "\\\\";
    } else if (*c == '"') {
      os << "\\\"";
    } else {
      os << *c;
    }
  }
  os << "\"";
}